

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

Au_Ntk_t * Au_NtkParseCBlif(char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Int_t *__ptr;
  Vec_Int_t *p;
  Au_Man_t *pMan_00;
  Vec_Int_t *vNum2Obj_00;
  Vec_Int_t *p_00;
  char *pcVar5;
  char *pcVar6;
  Au_Ntk_t *p_01;
  Au_Obj_t *pAVar7;
  Au_Obj_t *pAVar8;
  int Func;
  int Num;
  int Line;
  int nOutputs;
  int nInputs;
  int Id;
  int j;
  int k;
  int i;
  Vec_Int_t *vFanins;
  Vec_Int_t *vNum2Obj;
  Vec_Int_t *vLines;
  char *pCur;
  char *pBuffer;
  Au_Obj_t *pFan;
  Au_Obj_t *pBox;
  Au_Ntk_t *pRoot;
  Au_Man_t *pMan;
  FILE *pFile;
  char *pFileName_local;
  
  pBox = (Au_Obj_t *)0x0;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    __ptr = (Vec_Int_t *)Extra_FileRead((FILE *)__stream);
    fclose(__stream);
    p = Vec_IntAlloc(1000);
    Vec_IntPush(p,0);
    for (vLines = __ptr; (char)vLines->nCap != '\0'; vLines = (Vec_Int_t *)((long)&vLines->nCap + 1)
        ) {
      if ((char)vLines->nCap == '\n') {
        *(undefined1 *)&vLines->nCap = 0;
        Vec_IntPush(p,((int)vLines - (int)__ptr) + 1);
      }
    }
    pMan_00 = Au_ManAlloc(pFileName);
    vNum2Obj_00 = Vec_IntAlloc(1000);
    p_00 = Vec_IntAlloc(1000);
    for (j = 0; iVar1 = Vec_IntSize(p), j < iVar1; j = j + 1) {
      iVar1 = Vec_IntEntry(p,j);
      pcVar5 = strtok((char *)((long)&__ptr->nCap + (long)iVar1)," \t\r");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '#')) {
        if (*pcVar5 == '.') {
          Vec_IntClear(p_00);
          iVar2 = strcmp(pcVar5,".and");
          if (iVar2 == 0) {
            for (Id = 0; Id < 2; Id = Id + 1) {
              pcVar5 = strtok((char *)0x0," \t\r");
              iVar1 = atoi(pcVar5);
              iVar1 = Au_NtkRemapNum(vNum2Obj_00,iVar1);
              Vec_IntPush(p_00,iVar1);
            }
            iVar1 = Au_NtkCreateNode((Au_Ntk_t *)pBox,p_00,1);
            Vec_IntPush(vNum2Obj_00,iVar1);
          }
          else {
            iVar2 = strcmp(pcVar5,".xor");
            if (iVar2 == 0) {
              for (Id = 0; Id < 2; Id = Id + 1) {
                pcVar5 = strtok((char *)0x0," \t\r");
                iVar1 = atoi(pcVar5);
                iVar1 = Au_NtkRemapNum(vNum2Obj_00,iVar1);
                Vec_IntPush(p_00,iVar1);
              }
              iVar1 = Au_NtkCreateNode((Au_Ntk_t *)pBox,p_00,2);
              Vec_IntPush(vNum2Obj_00,iVar1);
            }
            else {
              iVar2 = strcmp(pcVar5,".mux");
              if (iVar2 == 0) {
                for (Id = 0; Id < 3; Id = Id + 1) {
                  pcVar5 = strtok((char *)0x0," \t\r");
                  iVar1 = atoi(pcVar5);
                  iVar1 = Au_NtkRemapNum(vNum2Obj_00,iVar1);
                  Vec_IntPush(p_00,iVar1);
                }
                iVar1 = Au_NtkCreateNode((Au_Ntk_t *)pBox,p_00,3);
                Vec_IntPush(vNum2Obj_00,iVar1);
              }
              else {
                iVar2 = strcmp(pcVar5,".subckt");
                if (iVar2 == 0) {
                  pcVar5 = strtok((char *)0x0," \t\r");
                  pcVar6 = strtok((char *)0x0," \t\r");
                  iVar1 = atoi(pcVar6);
                  pcVar6 = strtok((char *)0x0," \t\r");
                  iVar2 = atoi(pcVar6);
                  while ((pcVar6 = strtok((char *)0x0," \t\r"), pcVar6 != (char *)0x0 &&
                         (*pcVar6 != '#'))) {
                    Au_NtkParseCBlifNum(p_00,pcVar6,vNum2Obj_00);
                  }
                  iVar3 = Vec_IntSize(p_00);
                  if (iVar3 != iVar1) {
                    __assert_fail("Vec_IntSize(vFanins) == nInputs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                  ,0x41b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                  }
                  iVar1 = Au_NtkCreateBox((Au_Ntk_t *)pBox,p_00,iVar2,(int)pcVar5 - (int)__ptr);
                  pAVar7 = Au_NtkObj((Au_Ntk_t *)pBox,iVar1);
                  for (Id = 0; iVar1 = Au_BoxFanoutNum(pAVar7), Id < iVar1; Id = Id + 1) {
                    iVar1 = Au_BoxFanoutId(pAVar7,Id);
                    Vec_IntPush(vNum2Obj_00,iVar1);
                  }
                }
                else {
                  iVar2 = strcmp(pcVar5,".model");
                  if (iVar2 == 0) {
                    pcVar5 = strtok((char *)0x0," \t\r");
                    pBox = (Au_Obj_t *)Au_NtkAlloc(pMan_00,pcVar5);
                    iVar1 = Au_NtkCreateConst0((Au_Ntk_t *)pBox);
                    Vec_IntClear(vNum2Obj_00);
                    Vec_IntPush(vNum2Obj_00,iVar1);
                  }
                  else {
                    iVar2 = strcmp(pcVar5,".inputs");
                    if (iVar2 == 0) {
                      pcVar5 = strtok((char *)0x0," \t\r");
                      iVar1 = atoi(pcVar5);
                      for (Id = 0; Id < iVar1; Id = Id + 1) {
                        iVar2 = Au_NtkCreatePi((Au_Ntk_t *)pBox);
                        Vec_IntPush(vNum2Obj_00,iVar2);
                      }
                    }
                    else {
                      iVar2 = strcmp(pcVar5,".outputs");
                      if (iVar2 == 0) {
                        pcVar5 = strtok((char *)0x0," \t\r");
                        iVar1 = atoi(pcVar5);
                        while ((pcVar5 = strtok((char *)0x0," \t\r"), pcVar5 != (char *)0x0 &&
                               (*pcVar5 != '#'))) {
                          Au_NtkParseCBlifNum(p_00,pcVar5,vNum2Obj_00);
                        }
                        iVar2 = Vec_IntSize(p_00);
                        if (iVar2 != iVar1) {
                          __assert_fail("Vec_IntSize(vFanins) == nOutputs",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                        ,0x43b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                        }
                        for (Id = 0; iVar1 = Vec_IntSize(p_00), Id < iVar1; Id = Id + 1) {
                          iVar1 = Vec_IntEntry(p_00,Id);
                          Au_NtkCreatePo((Au_Ntk_t *)pBox,iVar1);
                        }
                      }
                      else {
                        iVar2 = strcmp(pcVar5,".end");
                        if (iVar2 != 0) {
                          printf("Unknown directive in line %d: \"%s\".\n",(ulong)(uint)j,
                                 (char *)((long)&__ptr->nCap + (long)iVar1));
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          printf("Cannot read directive in line %d: \"%s\".\n",(ulong)(uint)j,
                 (char *)((long)&__ptr->nCap + (long)iVar1));
        }
      }
    }
    Vec_IntFree(p_00);
    Vec_IntFree(vNum2Obj_00);
    Vec_IntFree(p);
    for (j = 1; iVar1 = Vec_PtrSize(&pMan_00->vNtks), j < iVar1; j = j + 1) {
      p_01 = Au_ManNtk(pMan_00,j);
      for (Id = 0; iVar1 = Vec_IntSize(&p_01->vObjs), Id < iVar1; Id = Id + 1) {
        pAVar7 = Au_NtkObjI(p_01,Id);
        iVar1 = Au_ObjIsBox(pAVar7);
        if (iVar1 != 0) {
          uVar4 = Au_ManFindNtk(pMan_00,(char *)((long)&__ptr->nCap +
                                                (long)(int)((uint)*(undefined8 *)pAVar7 & 0x3fffffff
                                                           )));
          *(ulong *)pAVar7 = *(ulong *)pAVar7 & 0xffffffffc0000000 | (ulong)uVar4 & 0x3fffffff;
          if (((undefined1  [16])*pAVar7 & (undefined1  [16])0x3fffffff) == (undefined1  [16])0x0) {
            __assert_fail("pBox->Func > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                          ,0x44a,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
          }
          for (nInputs = 0; iVar1 = Au_BoxFanoutNum(pAVar7), nInputs < iVar1; nInputs = nInputs + 1)
          {
            pAVar8 = Au_BoxFanout(pAVar7,nInputs);
            *(ulong *)pAVar8 =
                 *(ulong *)pAVar8 & 0xffffffffc0000000 |
                 (ulong)((uint)*(undefined8 *)pAVar7 & 0x3fffffff);
          }
        }
      }
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    pFileName_local = (char *)Au_ManNtkRoot(pMan_00);
    Au_ManReorderModels(pMan_00,(Au_Ntk_t *)pFileName_local);
  }
  return (Au_Ntk_t *)pFileName_local;
}

Assistant:

Au_Ntk_t * Au_NtkParseCBlif( char * pFileName )
{
    FILE * pFile;
    Au_Man_t * pMan;
    Au_Ntk_t * pRoot = NULL;
    Au_Obj_t * pBox, * pFan;
    char * pBuffer, * pCur;
    Vec_Int_t * vLines, * vNum2Obj, * vFanins;
    int i, k, j, Id, nInputs, nOutputs;
    int Line, Num, Func;
    // read the file
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    pBuffer = Extra_FileRead( pFile );
    fclose( pFile );
    // split into lines
    vLines = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLines, 0 );
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            *pCur = 0;
            Vec_IntPush( vLines, pCur - pBuffer + 1 );
        }
    // start the manager
    pMan = Au_ManAlloc( pFileName );
    // parse the lines
    vNum2Obj = Vec_IntAlloc( 1000 );
    vFanins = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vLines, Line, i )
    {
        pCur = strtok( pBuffer + Line, " \t\r" );
        if ( pCur == NULL || *pCur == '#' )
            continue;
        if ( *pCur != '.' )
        {
            printf( "Cannot read directive in line %d: \"%s\".\n", i, pBuffer + Line );
            continue;
        }
        Vec_IntClear( vFanins );
        if ( !strcmp(pCur, ".and") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 1 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".xor") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 2 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".mux") )
        {
            for ( k = 0; k < 3; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 3 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".subckt") )
        {
            pCur = strtok( NULL, " \t\r" );
            Func = pCur - pBuffer;
            pCur = strtok( NULL, " \t\r" );
            nInputs = atoi( pCur );
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break;
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nInputs );
            Id = Au_NtkCreateBox( pRoot, vFanins, nOutputs, Func );
            pBox = Au_NtkObj( pRoot, Id );
            Au_BoxForEachFanoutId( pBox, Num, k )
                Vec_IntPush( vNum2Obj, Num );
        }
        else if ( !strcmp(pCur, ".model") )
        {
            pCur  = strtok( NULL, " \t\r" );
            pRoot = Au_NtkAlloc( pMan, pCur );
            Id    = Au_NtkCreateConst0( pRoot );
            Vec_IntClear( vNum2Obj );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".inputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            Num  = atoi( pCur );
            for ( k = 0; k < Num; k++ )
                Vec_IntPush( vNum2Obj, Au_NtkCreatePi(pRoot) );
        }
        else if ( !strcmp(pCur, ".outputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break; 
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nOutputs );
            Vec_IntForEachEntry( vFanins, Num, k )
                Au_NtkCreatePo( pRoot, Num );
        }
        else if ( strcmp(pCur, ".end") )
            printf( "Unknown directive in line %d: \"%s\".\n", i, pBuffer + Line );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vNum2Obj );
    Vec_IntFree( vLines );
    // set pointers to models
    Au_ManForEachNtk( pMan, pRoot, i )
        Au_NtkForEachBox( pRoot, pBox, k )
        {
            pBox->Func = Au_ManFindNtk( pMan, pBuffer + pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    ABC_FREE( pBuffer );
    // order models in topological order
    pRoot = Au_ManNtkRoot( pMan );
    Au_ManReorderModels( pMan, pRoot );
    return pRoot;
}